

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  SPIRVariable *pSVar1;
  bool bVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  Bitset *pBVar8;
  Variant *pVVar9;
  uint *ts_1;
  char *pcVar10;
  char *__s1;
  byte bVar11;
  undefined3 in_register_00000081;
  bool bVar12;
  char *addr_space;
  Bitset flags;
  allocator local_c9;
  SPIRVariable *local_c8;
  uint local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  Bitset local_b0;
  undefined1 local_70 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_bc = CONCAT31(in_register_00000081,argument);
  local_70 = (undefined1  [8])0x0;
  local_68._M_buckets = &(((Bitset *)local_70)->higher)._M_h._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  uVar7 = (ulong)id;
  if ((uVar7 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar9 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar9[uVar7].type == TypeVariable)) {
    local_c8 = Variant::get<spirv_cross::SPIRVariable>(pVVar9 + uVar7);
    bVar11 = 1;
    if ((type->basetype != Struct) ||
       ((bVar2 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
        !bVar2 && (bVar2 = Compiler::has_decoration
                                     ((Compiler *)this,(ID)(type->super_IVariant).self.id,
                                      DecorationBufferBlock), !bVar2)))) goto LAB_001c6f30;
    Compiler::get_buffer_block_flags(&local_b0,(Compiler *)this,(VariableID)id);
    local_70 = (undefined1  [8])local_b0.lower;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&(((Bitset *)local_70)->higher)._M_h,&local_b0.higher);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b0.higher._M_h);
    bVar11 = 1;
  }
  else {
    bVar11 = 0;
    local_c8 = (SPIRVariable *)0x0;
LAB_001c6f30:
    pBVar8 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    pVVar9 = (Variant *)pBVar8->lower;
    local_70 = (undefined1  [8])pVVar9;
    if (pBVar8 != (Bitset *)local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&((Bitset *)local_70)->higher,&(pBVar8->higher)._M_h);
    }
  }
  local_b0.lower = 0;
  ts_1 = &switchD_001c6f84::switchdataD_002f2900;
  switch(type->storage) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case StorageClassPushConstant:
    if (type->basetype == Struct) {
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
      ts_1 = (uint *)0x2f6ac3;
      pcVar10 = "const device";
      if (((uint)local_70._0_4_ >> 0x18 & 1) == 0) {
        pcVar10 = "device";
      }
      __s1 = "constant";
      local_b0.lower = (uint64_t)"constant";
      if (bVar2) {
        __s1 = pcVar10;
        local_b0.lower = (uint64_t)pcVar10;
      }
      goto LAB_001c721c;
    }
    if ((char)local_bc == '\0') {
      __s1 = "constant";
      local_b0.lower = (uint64_t)"constant";
      goto LAB_001c721c;
    }
    if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      __s1 = "";
      local_b0.lower = (uint64_t)"";
      goto LAB_001c721c;
    }
    break;
  case StorageClassInput:
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar4 == ExecutionModelTessellationControl && (bVar11 ^ 1) == 0) &&
       ((local_c8->basevariable).id == (this->stage_in_ptr_var_id).id)) {
      __s1 = "threadgroup";
      local_b0.lower = (uint64_t)__s1;
      if ((this->msl_options).multi_patch_workgroup != false) {
        __s1 = "const device";
        local_b0.lower = (uint64_t)__s1;
      }
    }
    else {
      __s1 = (char *)0x0;
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    pSVar1 = local_c8;
    if ((EVar4 == ExecutionModelTessellationEvaluation) &&
       ((bVar11 & (this->msl_options).raw_buffer_tese_input) != 0)) {
      local_b4 = (local_c8->basevariable).id;
      local_b8 = (this->stage_in_ptr_var_id).id;
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(local_c8->super_IVariant).self.id,DecorationPatch);
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar1->super_IVariant).self.id,DecorationBuiltIn);
      uVar5 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(pSVar1->super_IVariant).self.id,DecorationBuiltIn);
      bVar12 = uVar5 - 0xb < 2;
      ts_1 = (uint *)(ulong)local_b8;
      if ((local_b4 == local_b8) ||
         (ts_1 = (uint *)(ulong)CONCAT31((int3)(local_b8 >> 8),bVar3 && bVar12),
         bVar2 && (!bVar3 || !bVar12))) {
        __s1 = "const device";
        local_b0.lower = 0x2fed18;
      }
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (((bVar11 ^ 1) == 0 && EVar4 == ExecutionModelFragment) &&
       ((local_c8->basevariable).id == (this->stage_in_var_id).id)) {
LAB_001c71a5:
      __s1 = "thread";
      local_b0.lower = (uint64_t)"thread";
      goto LAB_001c721c;
    }
    if (__s1 != (char *)0x0) goto LAB_001c721c;
    break;
  case StorageClassOutput:
    if (this->capture_output_to_buffer == true) {
      if (bVar11 != 0) {
        bVar2 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,local_c8);
        if (bVar2) {
          bVar2 = Compiler::is_tessellation_shader((Compiler *)this);
          if (!bVar2) goto LAB_001c71a5;
        }
        else {
          iVar6 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,local_c8,4)
          ;
          if ((char)iVar6 == '\0') {
            __s1 = (char *)local_b0.lower;
            if ((char *)local_b0.lower != (char *)0x0) goto LAB_001c721c;
            goto LAB_001c7210;
          }
        }
switchD_001c6f84_caseD_4:
        __s1 = "threadgroup";
        local_b0.lower = (uint64_t)"threadgroup";
        goto LAB_001c721c;
      }
      goto LAB_001c7210;
    }
    break;
  case StorageClassWorkgroup:
    goto switchD_001c6f84_caseD_4;
  case StorageClassCrossWorkgroup:
  case StorageClassPrivate:
  case StorageClassFunction:
  case StorageClassGeneric:
  case StorageClassAtomicCounter:
  case StorageClassImage:
    break;
  case StorageClassStorageBuffer:
switchD_001c6f84_caseD_c:
    if ((bVar11 == 0) ||
       (bVar2 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
       bVar2)) {
      __s1 = "const device";
      local_b0.lower = (uint64_t)"const device";
      if (((ulong)local_70 & 0x1000000) == 0) {
        __s1 = "device";
        local_b0.lower = (uint64_t)"device";
      }
      goto LAB_001c721c;
    }
LAB_001c7210:
    __s1 = "device";
    local_b0.lower = (uint64_t)"device";
    goto LAB_001c721c;
  default:
    ts_1 = (uint *)pVVar9;
    if (type->storage == StorageClassPhysicalStorageBuffer) goto switchD_001c6f84_caseD_c;
  }
  ts_1 = (uint *)0x2eb969;
  __s1 = "";
  if (type->basetype == ControlPointArray) {
    __s1 = "thread";
  }
  if ((local_bc & 1) == 0) {
    __s1 = "";
  }
  local_b0.lower = (uint64_t)__s1;
  if (type->pointer != false) {
    __s1 = "thread";
    local_b0.lower = (uint64_t)"thread";
  }
LAB_001c721c:
  if ((((ulong)local_70 & 0xa00000) == 0) || (iVar6 = strcmp(__s1,"thread"), iVar6 == 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,__s1,&local_c9);
  }
  else {
    join<char_const(&)[10],char_const*&>
              (__return_storage_ptr__,(spirv_cross *)"volatile ",(char (*) [10])&local_b0,
               (char **)ts_1);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(((Bitset *)local_70)->higher)._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}